

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O1

int decode_hex(BIGNUM *bn,char *in,int in_len)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  uint8_t hex;
  byte local_45;
  uint local_44;
  char *local_40;
  BIGNUM *local_38;
  
  local_40 = in;
  if (in_len < 0x20000000) {
    iVar2 = bn_expand(bn,(long)(in_len * 4));
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      lVar5 = 0;
      if (0 < in_len) {
        local_38 = bn;
        do {
          local_44 = 0x10;
          if (in_len < 0x10) {
            local_44 = in_len;
          }
          if (in_len < 1) {
            uVar4 = 0;
          }
          else {
            uVar7 = (ulong)(uint)in_len;
            uVar4 = 0x10;
            if (uVar7 < 0x10) {
              uVar4 = uVar7;
            }
            lVar3 = uVar4 + 1;
            pcVar8 = local_40 + (uVar7 - uVar4);
            uVar4 = 0;
            do {
              local_45 = 0;
              iVar2 = OPENSSL_fromxdigit(&local_45,(int)*pcVar8);
              if (iVar2 == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                              ,99,"int decode_hex(BIGNUM *, const char *, int)");
              }
              uVar4 = uVar4 << 4 | (ulong)local_45;
              lVar3 = lVar3 + -1;
              pcVar8 = pcVar8 + 1;
            } while (1 < lVar3);
          }
          local_38->d[lVar5] = uVar4;
          lVar5 = lVar5 + 1;
          uVar6 = in_len - local_44;
          bVar1 = (int)local_44 <= in_len;
          bn = local_38;
          in_len = uVar6;
        } while (uVar6 != 0 && bVar1);
      }
      if (bn->dmax < (int)lVar5) {
        __assert_fail("i <= bn->dmax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                      ,0x6b,"int decode_hex(BIGNUM *, const char *, int)");
      }
      bn->width = (int)lVar5;
      iVar2 = 1;
    }
  }
  else {
    iVar2 = 0;
    ERR_put_error(3,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                  ,0x4d);
  }
  return iVar2;
}

Assistant:

static int decode_hex(BIGNUM *bn, const char *in, int in_len) {
  if (in_len > INT_MAX / 4) {
    OPENSSL_PUT_ERROR(BN, BN_R_BIGNUM_TOO_LONG);
    return 0;
  }
  // |in_len| is the number of hex digits.
  if (!bn_expand(bn, in_len * 4)) {
    return 0;
  }

  int i = 0;
  while (in_len > 0) {
    // Decode one |BN_ULONG| at a time.
    int todo = BN_BYTES * 2;
    if (todo > in_len) {
      todo = in_len;
    }

    BN_ULONG word = 0;
    int j;
    for (j = todo; j > 0; j--) {
      uint8_t hex = 0;
      if (!OPENSSL_fromxdigit(&hex, in[in_len - j])) {
        // This shouldn't happen. The caller checks |OPENSSL_isxdigit|.
        assert(0);
      }
      word = (word << 4) | hex;
    }

    bn->d[i++] = word;
    in_len -= todo;
  }
  assert(i <= bn->dmax);
  bn->width = i;
  return 1;
}